

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O0

void __thiscall lest::message::~message(message *this)

{
  message *this_local;
  
  *(undefined ***)this = &PTR__message_001e9aa8;
  comment::~comment(&this->note);
  location::~location(&this->where);
  std::__cxx11::string::~string((string *)&this->kind);
  std::runtime_error::~runtime_error(&this->super_runtime_error);
  return;
}

Assistant:

message( text kind_, location where_, text expr_, text note_ = "" )
    : std::runtime_error( expr_), kind( kind_), where( where_), note( note_) {}